

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O3

void api_suite::run(void)

{
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 *local_28;
  undefined1 **local_20;
  undefined1 *local_18;
  
  api_ctor_default();
  api_capacity();
  api_size();
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  if (boost::detail::test_results()::instance == '\0') {
    local_28 = (undefined1 *)&local_48;
    local_20 = &local_28;
    local_18 = (undefined1 *)&local_48;
    run();
  }
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_28 = (undefined1 *)&local_48;
  local_20 = &local_28;
  local_18 = (undefined1 *)&local_48;
  if (boost::detail::test_results()::instance == '\0') {
    local_28 = (undefined1 *)&local_48;
    local_18 = (undefined1 *)&local_48;
    run();
  }
  api_clear();
  api_insert_value();
  api_insert_hint();
  api_emplace_value();
  api_emplace_value();
  api_emplace_hint();
  api_erase_key();
  api_contains();
  api_find();
  api_lower_bound();
  api_index_operator();
  api_begin_end();
  api_begin_end_const();
  api_cbegin_cend();
  api_key_comp();
  return;
}

Assistant:

void run()
{
    api_ctor_default();
    api_capacity();
    api_size();
    api_empty();
    api_full();
    api_clear();
    api_insert_value();
    api_insert_hint();
    api_emplace_value();
    api_emplace_value();
    api_emplace_hint();
    api_erase_key();
    api_contains();
    api_find();
    api_lower_bound();
    api_index_operator();
    api_begin_end();
    api_begin_end_const();
    api_cbegin_cend();
    api_key_comp();
}